

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O2

bool cmCMakePresetsGraphInternal::ConfigurePresetsHelper
               (vector<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  Object<cmCMakePresetsGraph::ConfigurePreset> *in_RCX;
  code *local_80 [2];
  code *local_70;
  code *local_68;
  Object<cmCMakePresetsGraph::ConfigurePreset> local_60;
  
  if (ConfigurePresetsHelper(std::vector<cmCMakePresetsGraph::ConfigurePreset,std::allocator<cmCMakePresetsGraph::ConfigurePreset>>&,Json::Value_const*,cmJSONState*)
      ::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&ConfigurePresetsHelper(std::vector<cmCMakePresetsGraph::ConfigurePreset,std::allocator<cmCMakePresetsGraph::ConfigurePreset>>&,Json::Value_const*,cmJSONState*)
                                 ::helper);
    if (iVar2 != 0) {
      local_80[1] = (code *)0x0;
      local_80[0] = cmCMakePresetsErrors::INVALID_PRESETS;
      local_68 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_invoke;
      local_70 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_manager;
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::Object
                (&local_60,
                 (Object<cmCMakePresetsGraph::ConfigurePreset> *)
                 (anonymous_namespace)::ConfigurePresetHelper);
      cmJSONHelperBuilder::
      Vector<cmCMakePresetsGraph::ConfigurePreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>>
                (&ConfigurePresetsHelper::helper,(cmJSONHelperBuilder *)local_80,
                 (ErrorGenerator *)&local_60,in_RCX);
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::~Object(&local_60);
      std::_Function_base::~_Function_base((_Function_base *)local_80);
      __cxa_atexit(std::_Function_base::~_Function_base,&ConfigurePresetsHelper::helper,
                   &__dso_handle);
      __cxa_guard_release(&ConfigurePresetsHelper(std::vector<cmCMakePresetsGraph::ConfigurePreset,std::allocator<cmCMakePresetsGraph::ConfigurePreset>>&,Json::Value_const*,cmJSONState*)
                           ::helper);
    }
  }
  bVar1 = std::
          function<bool_(std::vector<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>_&,_const_Json::Value_*,_cmJSONState_*)>
          ::operator()(&ConfigurePresetsHelper::helper,out,value,state);
  return bVar1;
}

Assistant:

bool ConfigurePresetsHelper(std::vector<ConfigurePreset>& out,
                            const Json::Value* value, cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::Vector<ConfigurePreset>(
    cmCMakePresetsErrors::INVALID_PRESETS, ConfigurePresetHelper);

  return helper(out, value, state);
}